

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O3

void reoProfileWidthPrint(reo_man *p)

{
  uint uVar1;
  reo_plane *prVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  if (p->nSupp < 0) {
    uVar3 = 0;
    iVar4 = 0;
  }
  else {
    prVar2 = p->pPlanes;
    uVar6 = 0xffffffffffffffff;
    lVar5 = 8;
    iVar4 = 0;
    uVar3 = 0;
    do {
      uVar6 = uVar6 + 1;
      printf("Level = %2d. Width = %3d.\n",uVar6 & 0xffffffff,
             (ulong)*(uint *)((long)&prVar2->fSifted + lVar5));
      prVar2 = p->pPlanes;
      uVar1 = *(uint *)((long)&prVar2->fSifted + lVar5);
      if ((int)uVar3 <= (int)uVar1) {
        uVar3 = uVar1;
      }
      iVar4 = iVar4 + uVar1;
      lVar5 = lVar5 + 0x38;
    } while ((long)uVar6 < (long)p->nSupp);
  }
  if (p->nWidthCur != iVar4) {
    __assert_fail("p->nWidthCur == TotalWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoProfile.c"
                  ,0x150,"void reoProfileWidthPrint(reo_man *)");
  }
  printf("WIDTH: ");
  printf("Maximum = %5d.  ",(ulong)uVar3);
  printf("Total = %7d.  ",(ulong)(uint)p->nWidthCur);
  printf("Average = %6.2f.\n",(double)((float)iVar4 / (float)p->nSupp));
  return;
}

Assistant:

void reoProfileWidthPrint( reo_man * p )
{
    int WidthMax;
    int TotalWidth;
    int i;

    WidthMax   = 0;
    TotalWidth = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        printf( "Level = %2d. Width = %3d.\n", i, p->pPlanes[i].statsWidth );
        if ( WidthMax < p->pPlanes[i].statsWidth )
             WidthMax = p->pPlanes[i].statsWidth;
        TotalWidth += p->pPlanes[i].statsWidth;
    }
    assert( p->nWidthCur == TotalWidth );
    printf( "WIDTH: " );
    printf( "Maximum = %5d.  ", WidthMax );
    printf( "Total = %7d.  ", p->nWidthCur );
    printf( "Average = %6.2f.\n", TotalWidth / (float)p->nSupp );
}